

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  uint uVar1;
  CURLcode CVar2;
  size_t in_RAX;
  size_t consumed;
  size_t local_28;
  
  local_28 = in_RAX;
  CVar2 = Curl_http_write_resp_hds(data,buf,blen,&local_28);
  if (CVar2 == CURLE_OK) {
    uVar1 = *(uint *)&(data->req).field_0xd1;
    CVar2 = CURLE_OK;
    if ((uVar1 & 2) == 0) {
      if ((blen - local_28 != 0 || is_eos) && (uVar1 & 1) == 0) {
        CVar2 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,buf + local_28,blen - local_28);
        return CVar2;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http_write_resp(struct Curl_easy *data,
                              const char *buf, size_t blen,
                              bool is_eos)
{
  CURLcode result;
  size_t consumed;
  int flags;

  result = Curl_http_write_resp_hds(data, buf, blen, &consumed);
  if(result || data->req.done)
    goto out;

  DEBUGASSERT(consumed <= blen);
  blen -= consumed;
  buf += consumed;
  /* either all was consumed in header parsing, or we have data left
   * and are done with headers, e.g. it is BODY data */
  DEBUGASSERT(!blen || !data->req.header);
  if(!data->req.header && (blen || is_eos)) {
    /* BODY data after header been parsed, write and consume */
    flags = CLIENTWRITE_BODY;
    if(is_eos)
      flags |= CLIENTWRITE_EOS;
    result = Curl_client_write(data, flags, buf, blen);
  }
out:
  return result;
}